

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O1

err_t btokSMCmdUnwrap(apdu_cmd_t *cmd,size_t *size,octet *apdu,size_t count,void *state)

{
  void *state_00;
  bool bVar1;
  ushort uVar2;
  bool_t bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ushort **val;
  ulong uVar7;
  octet *mac;
  octet *cdf;
  size_t rdf_len_len;
  ulong local_80;
  size_t *local_78;
  ushort *local_70;
  octet *local_68;
  octet *local_60;
  ushort **local_58;
  size_t local_50;
  octet *local_48;
  size_t local_40;
  size_t local_38;
  
  if (count < 4) {
    return 0x138;
  }
  if (count < 0x10 && state != (void *)0x0) {
    return 0x138;
  }
  local_78 = size;
  if (state == (void *)0x0) {
    if ((*apdu & 4) != 0) {
      return 0x138;
    }
    sVar6 = apduCmdDec(cmd,apdu,count);
    if (sVar6 == 0xffffffffffffffff) {
      return 0x138;
    }
    if (size == (size_t *)0x0) {
      return 0;
    }
    goto LAB_0013fc90;
  }
  if ((*apdu & 4) == 0) {
    return 0x138;
  }
  sVar6 = (size_t)apdu[4];
  if (sVar6 == 0) {
    sVar6 = (size_t)(ushort)(*(ushort *)(apdu + 5) << 8 | *(ushort *)(apdu + 5) >> 8);
    uVar7 = 3;
  }
  else {
    uVar7 = 1;
  }
  if (sVar6 + uVar7 + 5 != count) {
    return 0x138;
  }
  bVar3 = memIsZero(apdu + sVar6 + uVar7 + 4,1);
  if (bVar3 == 0) {
    return 0x138;
  }
  local_60 = apdu + (uVar7 | 4);
  local_50 = derDec2(&local_68,&local_80,local_60,sVar6,0x87);
  if (local_50 == 0xffffffffffffffff) {
    local_80 = 0;
    local_50 = 0;
  }
  else {
    if (local_80 < 2) {
      return 0x138;
    }
    if (*local_68 != '\x02') {
      return 0x138;
    }
    local_68 = local_68 + 1;
    local_80 = local_80 - 1;
  }
  local_48 = local_60 + local_50;
  local_40 = sVar6 - local_50;
  val = &local_70;
  sVar4 = derDec2((octet **)val,&local_38,local_48,local_40,0x97);
  if (sVar4 == 0xffffffffffffffff) {
    sVar4 = 0;
    val = (ushort **)0x0;
    goto LAB_0013fcfa;
  }
  if (local_38 - 4 < 0xfffffffffffffffd) {
    bVar1 = false;
  }
  else if (local_38 == 2) {
    uVar2 = *local_70 << 8 | *local_70 >> 8;
    val = (ushort **)0x10000;
    if (uVar2 != 0) {
      val = (ushort **)(ulong)uVar2;
    }
    bVar1 = false;
    if ((local_80 != 0) && (0xff < local_80 || (ushort **)0x100 < val)) goto LAB_0013fcfa;
  }
  else if (local_38 == 1) {
    val = (ushort **)0x100;
    if ((ushort **)(ulong)(byte)*local_70 != (ushort **)0x0) {
      val = (ushort **)(ulong)(byte)*local_70;
    }
    if (local_80 < 0x100) {
LAB_0013fcfa:
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    uVar2 = *(ushort *)((long)local_70 + 1) << 8 | *(ushort *)((long)local_70 + 1) >> 8;
    val = (ushort **)0x10000;
    if (uVar2 != 0) {
      val = (ushort **)(ulong)uVar2;
    }
    bVar1 = false;
    if ((((byte)*local_70 == 0) && (local_80 == 0)) && (0x100 < (uint)val)) goto LAB_0013fcfa;
  }
  if (!bVar1) {
    return 0x138;
  }
  local_58 = val;
  sVar5 = derDec3((octet **)&local_70,local_48 + sVar4,local_40 - sVar4,0x8e,8);
  if (sVar5 == 0xffffffffffffffff) {
    return 0x138;
  }
  sVar4 = sVar4 + local_50;
  if (sVar5 + sVar4 != sVar6) {
    return 0x138;
  }
  if (cmd == (apdu_cmd_t *)0x0) {
    if (local_78 == (size_t *)0x0) {
      return 0;
    }
    sVar6 = local_80 + 0x18;
  }
  else {
    if ((*(byte *)((long)state + 0x40) & 1) == 0) {
      return 0x205;
    }
    state_00 = (void *)((long)state + 0x50);
    beltMACStart(state_00,(octet *)state,0x20);
    beltMACStepA((octet *)((long)state + 0x40),0x10,state_00);
    beltMACStepA(apdu,4,state_00);
    beltMACStepA(local_60,sVar4,state_00);
    bVar3 = beltMACStepV((octet *)local_70,state_00);
    if (bVar3 == 0) {
      return 0x1ff;
    }
    memSet(cmd,'\0',0x18);
    cmd->cla = *apdu & 0xfb;
    cmd->ins = apdu[1];
    cmd->p1 = apdu[2];
    cmd->p2 = apdu[3];
    cmd->rdf_len = (size_t)local_58;
    cmd->cdf_len = local_80;
    memCopy(cmd + 1,local_68,local_80);
    if (local_80 != 0) {
      beltCFBStart(state_00,(octet *)((long)state + 0x20),0x20,(octet *)((long)state + 0x40));
      beltCFBStepD(cmd + 1,local_80,state_00);
    }
    if (local_78 == (size_t *)0x0) {
      return 0;
    }
    sVar6 = cmd->cdf_len + 0x18;
  }
LAB_0013fc90:
  *local_78 = sVar6;
  return 0;
}

Assistant:

err_t btokSMCmdUnwrap(apdu_cmd_t* cmd, size_t* size, const octet apdu[],
	size_t count, void* state)
{
	size_t len;
	size_t offset;
	size_t c1, c2, c3;
	size_t cdf_len;
	size_t cdf_len_len;
	const octet* cdf;
	size_t rdf_len;
	const octet* mac;
	btok_sm_st* st;
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(cmd, sizeof(apdu_cmd_t)));
	// слишком короткая команда?
	// нужно снять защиту с незащищенной команды?
	// невозможно снять защиту?
	if (count < 4 || state && count < 16 ||
		state && (apdu[0] & 0x04) == 0 ||
		!state && (apdu[0] & 0x04) != 0)
		return ERR_BAD_APDU;
	// декодировать без снятия защиты?
	if (!state)
	{
		offset = apduCmdDec(cmd, apdu, count);
		if (offset == SIZE_MAX)
			return ERR_BAD_APDU;
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			ASSERT(cmd == 0 ||
				memIsDisjoint2(size, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*size = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), apdu, count));
	// разобрать длину защищенного поля cdf
	if (apdu[4] != 0)
	{
		len = apdu[4];
		cdf_len_len = 1;
	}
	else
	{
		len = apdu[5], len *= 256, len += apdu[6];
		cdf_len_len = 3;
	}
	offset = 4 + cdf_len_len;
	// проверить длину кода, а также его завершение (Le*)
	if (4 + cdf_len_len + len + 1 != count ||
		!memIsZero(apdu + 4 + cdf_len_len + len, 1))
		return ERR_BAD_APDU;
	// разобрать защищенное поле cdf: шифртекст
	c1 = derDec2(&cdf, &cdf_len, apdu + offset, len, 0x87);
	if (c1 != SIZE_MAX)
	{
		if (cdf_len < 2 || cdf[0] != 0x02)
			return ERR_BAD_APDU;
		++cdf, --cdf_len;
	}
	else
		c1 = cdf_len = 0;
	// разобрать защищенное поле cdf: rdf_len
	{
		const octet* val;
		size_t rdf_len_len;
		c2 = derDec2(&val, &rdf_len_len, apdu + offset + c1, len - c1, 0x97);
		if (c2 != SIZE_MAX)
		{
			if (rdf_len_len == 0 || rdf_len_len > 3)
				return ERR_BAD_APDU;
			else if (rdf_len_len == 1)
			{
				rdf_len = val[0];
				if (rdf_len == 0)
					rdf_len = 256;
				if (cdf_len >= 256)
					return ERR_BAD_APDU;
			}
			else if (rdf_len_len == 2)
			{
				rdf_len = val[0], rdf_len *= 256, rdf_len += val[1];
				if (rdf_len == 0)
					rdf_len = 65536;
				if (cdf_len < 256 && rdf_len <= 256 || cdf_len == 0)
					return ERR_BAD_APDU;
			}
			else
			{
				rdf_len = val[1], rdf_len *= 256, rdf_len += val[2];
				if (rdf_len == 0)
					rdf_len = 65536;
				if (val[0] != 0 || cdf_len != 0 || rdf_len <= 256)
					return ERR_BAD_APDU;
			}
		}
		else
			c2 = rdf_len = 0;
	}
	// разобрать защищенное поле cdf: имитовставка
	c3 = derDec3(&mac, apdu + offset + c1 + c2, len - c1 - c2, 0x8E, 8);
	if (c3 == SIZE_MAX || c1 + c2 + c3 != len)
		return ERR_BAD_APDU;
	// ограничиться проверкой формата?
	if (!cmd)
	{
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			*size = sizeof(apdu_cmd_t) + cdf_len;
		}
		return ERR_OK;
	}
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 1)
		return ERR_BAD_LOGIC;
	// проверить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, 4, st->stack);
	beltMACStepA(apdu + offset, c1 + c2, st->stack);
	if (!beltMACStepV(mac, st->stack))
		return ERR_BAD_MAC;
	// заполнить поля команды
	memSetZero(cmd, sizeof(apdu_cmd_t));
	cmd->cla = apdu[0] & 0xFB;
	cmd->ins = apdu[1], cmd->p1 = apdu[2], cmd->p2 = apdu[3];
	cmd->rdf_len = rdf_len;
	cmd->cdf_len = cdf_len;
	memCopy(cmd->cdf, cdf, cdf_len);
	ASSERT(memIsDisjoint2(cmd, apduCmdSizeof(cmd), state, btokSM_keep()));
	ASSERT(memIsDisjoint2(cmd, apduCmdSizeof(cmd), apdu, count));
	// расшифровать cdf
	if (cdf_len)
	{
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepD(cmd->cdf, cdf_len, st->stack);
	}
	// возвратить размер
	if (size)
	{
		ASSERT(memIsDisjoint2(size, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
		ASSERT(memIsDisjoint2(size, O_PER_S, cmd, apduCmdSizeof(cmd)));
		*size = apduCmdSizeof(cmd);
	}
	// завершить
	return ERR_OK;
}